

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmgram.cpp
# Opt level: O0

void __thiscall CVmObjGramProd::mark_undo_ref(CVmObjGramProd *this,CVmUndoRecord *undo_rec)

{
  vmgram_alt_info *alt;
  long lVar1;
  CVmObjGramProd *in_RSI;
  undefined8 in_RDI;
  vmgram_undo_rec *rec;
  
  if (((in_RSI->super_CVmObject).ext_ != (char *)0x0) &&
     (alt = (vmgram_alt_info *)(in_RSI->super_CVmObject).ext_, lVar1._0_4_ = alt->del,
     lVar1._4_4_ = alt->proc_obj, lVar1 != 0)) {
    mark_alt_refs(in_RSI,alt,(uint)((ulong)in_RDI >> 0x20));
  }
  return;
}

Assistant:

void CVmObjGramProd::mark_undo_ref(VMG_ CVmUndoRecord *undo_rec)
{
    /* check for our private record type */
    if (undo_rec->id.ptrval != 0)
    {
        /* get our private undo record, properly cast */
        vmgram_undo_rec *rec = (vmgram_undo_rec *)undo_rec->id.ptrval;

        /* if it record an alternative, mark its references */
        if (rec->alt != 0)
            mark_alt_refs(vmg_ rec->alt, VMOBJ_REACHABLE);
    }
}